

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBaseRunner.cpp
# Opt level: O3

bool __thiscall xmrig::CudaBaseRunner::set(CudaBaseRunner *this,Job *job,uint8_t *blob)

{
  uint64_t uVar1;
  bool bVar2;
  
  uVar1 = job->m_target;
  this->m_height = job->m_height;
  this->m_target = uVar1;
  bVar2 = CudaLib::setJob(this->m_ctx,blob,job->m_size,job->m_extraIters);
  bVar2 = callWrapper(this,bVar2);
  return bVar2;
}

Assistant:

bool xmrig::CudaBaseRunner::set(const Job &job, uint8_t *blob)
{
    m_height = job.height();
    m_target = job.target();

    return callWrapper(CudaLib::setJob(m_ctx, blob, job.size(), job.extraIters()));
}